

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O2

void PointBlock<3U>::save(void *b_,BinaryBuffer *bb)

{
  diy::Serialization<diy::Bounds<float>_>::save(bb,(Bounds<float> *)b_);
  diy::Serialization<diy::Bounds<float>_>::save(bb,(Bounds<float> *)((long)b_ + 0x80));
  diy::Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
  save(bb,(Vector *)((long)b_ + 0x100));
  return;
}

Assistant:

static void     save(const void* b_, diy::BinaryBuffer& bb)
    {
        const PointBlock* b = static_cast<const PointBlock*>(b_);
        diy::save(bb, b->bounds);
        diy::save(bb, b->box);
        diy::save(bb, b->points);
    }